

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

char * fmt::v10::detail::do_parse_arg_id<char,fmt::v10::detail::dynamic_spec_id_handler<char>&>
                 (char *begin,char *end,dynamic_spec_id_handler<char> *handler)

{
  byte bVar1;
  arg_ref<char> *paVar2;
  byte *pbVar3;
  byte *pbVar4;
  int iVar5;
  byte *local_18;
  
  bVar1 = *begin;
  local_18 = (byte *)begin;
  if ((byte)(bVar1 - 0x30) < 10) {
    if (bVar1 == 0x30) {
      local_18 = (byte *)(begin + 1);
      iVar5 = 0;
    }
    else {
      iVar5 = parse_nonnegative_int<char>((char **)&local_18,end,0x7fffffff);
    }
    if ((local_18 == (byte *)end) || ((*local_18 != 0x3a && (*local_18 != 0x7d)))) {
LAB_0014ada2:
      throw_format_error("invalid format string");
    }
    paVar2 = handler->ref;
    paVar2->kind = index;
    (paVar2->val).index = iVar5;
    if (0 < handler->ctx->next_arg_id_) {
      throw_format_error("cannot switch from automatic to manual argument indexing");
    }
    handler->ctx->next_arg_id_ = -1;
  }
  else {
    if ((bVar1 != 0x5f) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) goto LAB_0014ada2;
    pbVar4 = (byte *)(begin + 1);
    do {
      pbVar3 = pbVar4;
      local_18 = (byte *)end;
      if (pbVar3 == (byte *)end) break;
      bVar1 = *pbVar3;
      pbVar4 = pbVar3 + 1;
    } while ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) ||
            (local_18 = pbVar3, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
    if ((long)local_18 - (long)begin < 0) {
      local_18 = (byte *)begin;
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/fmt/include/fmt/core.h"
                  ,0x17a,"negative value");
    }
    paVar2 = handler->ref;
    paVar2->kind = name;
    (paVar2->val).name.data_ = begin;
    (paVar2->val).name.size_ = (long)local_18 - (long)begin;
  }
  return (char *)local_18;
}

Assistant:

FMT_CONSTEXPR auto do_parse_arg_id(const Char* begin, const Char* end,
                                   Handler&& handler) -> const Char* {
  Char c = *begin;
  if (c >= '0' && c <= '9') {
    int index = 0;
    constexpr int max = (std::numeric_limits<int>::max)();
    if (c != '0')
      index = parse_nonnegative_int(begin, end, max);
    else
      ++begin;
    if (begin == end || (*begin != '}' && *begin != ':'))
      throw_format_error("invalid format string");
    else
      handler.on_index(index);
    return begin;
  }
  if (!is_name_start(c)) {
    throw_format_error("invalid format string");
    return begin;
  }
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(*it) || ('0' <= *it && *it <= '9')));
  handler.on_name({begin, to_unsigned(it - begin)});
  return it;
}